

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
::begin(raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
        *this)

{
  bool bVar1;
  ctrl_t *pcVar2;
  CommonFields *pCVar3;
  MaybeInitializedPtr slot;
  GenerationType *generation_ptr;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>
  *this_local;
  iterator it;
  
  bVar1 = empty(this);
  if (bVar1) {
    _this_local = end(this);
  }
  else {
    bVar1 = is_soo(this);
    if (bVar1) {
      _this_local = soo_iterator(this);
    }
    else {
      pcVar2 = control(this);
      pCVar3 = common(this);
      slot = CommonFields::slots_union(pCVar3);
      pCVar3 = common(this);
      generation_ptr =
           CommonFieldsGenerationInfoDisabled::generation_ptr
                     ((CommonFieldsGenerationInfoDisabled *)pCVar3);
      iterator::iterator((iterator *)&this_local,pcVar2,slot,generation_ptr);
      iterator::skip_empty_or_deleted((iterator *)&this_local);
      pcVar2 = iterator::control((iterator *)&this_local);
      bVar1 = IsFull(*pcVar2);
      if (!bVar1) {
        __assert_fail("IsFull(*it.control())",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xb1e,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, upb::generator::FieldClass>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, upb::generator::FieldClass>>>::begin() [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, upb::generator::FieldClass>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, upb::generator::FieldClass>>]"
                     );
      }
    }
  }
  return _this_local;
}

Assistant:

iterator begin() ABSL_ATTRIBUTE_LIFETIME_BOUND {
    if (ABSL_PREDICT_FALSE(empty())) return end();
    if (is_soo()) return soo_iterator();
    iterator it = {control(), common().slots_union(),
                   common().generation_ptr()};
    it.skip_empty_or_deleted();
    assert(IsFull(*it.control()));
    return it;
  }